

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextbrowser.cpp
# Opt level: O0

void QTextBrowser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  ResourceType *pRVar1;
  bool bVar2;
  ResourceType RVar3;
  QTextBrowser *pQVar4;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QTextBrowser *_t;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QTextBrowser *in_stack_ffffffffffffff30;
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      backwardAvailable((QTextBrowser *)0x6dfab4,(bool)in_stack_ffffffffffffff2f);
      break;
    case 1:
      forwardAvailable((QTextBrowser *)0x6dfad9,(bool)in_stack_ffffffffffffff2f);
      break;
    case 2:
      historyChanged((QTextBrowser *)0x6dfaeb);
      break;
    case 3:
      sourceChanged(in_stack_ffffffffffffff30,
                    (QUrl *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      break;
    case 4:
      highlighted(in_stack_ffffffffffffff30,
                  (QUrl *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      break;
    case 5:
      anchorClicked(in_stack_ffffffffffffff30,
                    (QUrl *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      break;
    case 6:
      setSource(in_stack_ffffffffffffff30,
                (QUrl *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                UnknownResource);
      break;
    case 7:
      setSource(in_stack_ffffffffffffff30,
                (QUrl *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                UnknownResource);
      break;
    case 8:
      (**(code **)(*in_RDI + 0x1f0))();
      break;
    case 9:
      (**(code **)(*in_RDI + 0x1f8))();
      break;
    case 10:
      (**(code **)(*in_RDI + 0x200))();
      break;
    case 0xb:
      (**(code **)(*in_RDI + 0x208))();
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar2 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(bool)>
                           (in_RCX,(void **)backwardAvailable,0,0), !bVar2 &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(bool)>
                           (in_RCX,(void **)forwardAvailable,0,1), !bVar2)) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)()>
                          (in_RCX,(void **)historyChanged,0,2), !bVar2)) &&
      (((bVar2 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(QUrl_const&)>
                           (in_RCX,(void **)sourceChanged,0,3), !bVar2 &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(QUrl_const&)>
                           (in_RCX,(void **)highlighted,0,4), !bVar2)) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QTextBrowser::*)(QUrl_const&)>
                          (in_RCX,(void **)anchorClicked,0,5), !bVar2)))))) {
    if (in_ESI == 1) {
      pRVar1 = *(ResourceType **)in_RCX;
      pQVar4 = (QTextBrowser *)(ulong)in_EDX;
      switch(pQVar4) {
      case (QTextBrowser *)0x0:
        source(pQVar4);
        QUrl::operator=((QUrl *)in_stack_ffffffffffffff30,
                        (QUrl *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        QUrl::~QUrl(&local_10);
        break;
      case (QTextBrowser *)0x1:
        RVar3 = sourceType((QTextBrowser *)
                           CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        *pRVar1 = RVar3;
        break;
      case (QTextBrowser *)0x2:
        searchPaths(pQVar4);
        QList<QString>::operator=
                  ((QList<QString> *)in_stack_ffffffffffffff30,
                   (QList<QString> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        QList<QString>::~QList((QList<QString> *)0x6dfe30);
        break;
      case (QTextBrowser *)0x3:
        bVar2 = openExternalLinks(in_stack_ffffffffffffff30);
        *(bool *)pRVar1 = bVar2;
        break;
      case (QTextBrowser *)0x4:
        bVar2 = openLinks(in_stack_ffffffffffffff30);
        *(bool *)pRVar1 = bVar2;
      }
    }
    if (in_ESI == 2) {
      pQVar4 = (QTextBrowser *)(ulong)in_EDX;
      switch(pQVar4) {
      case (QTextBrowser *)0x0:
        setSource(pQVar4,(QUrl *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                  UnknownResource);
        break;
      default:
        break;
      case (QTextBrowser *)0x2:
        setSearchPaths(pQVar4,(QStringList *)
                              CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        break;
      case (QTextBrowser *)0x3:
        setOpenExternalLinks(pQVar4,(bool)in_stack_ffffffffffffff2f);
        break;
      case (QTextBrowser *)0x4:
        setOpenLinks(pQVar4,(bool)in_stack_ffffffffffffff2f);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextBrowser *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->backwardAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->forwardAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->historyChanged(); break;
        case 3: _t->sourceChanged((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 4: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 5: _t->anchorClicked((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 6: _t->setSource((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTextDocument::ResourceType>>(_a[2]))); break;
        case 7: _t->setSource((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 8: _t->backward(); break;
        case 9: _t->forward(); break;
        case 10: _t->home(); break;
        case 11: _t->reload(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(bool )>(_a, &QTextBrowser::backwardAvailable, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(bool )>(_a, &QTextBrowser::forwardAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)()>(_a, &QTextBrowser::historyChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::sourceChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::highlighted, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::anchorClicked, 5))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QUrl*>(_v) = _t->source(); break;
        case 1: *reinterpret_cast<QTextDocument::ResourceType*>(_v) = _t->sourceType(); break;
        case 2: *reinterpret_cast<QStringList*>(_v) = _t->searchPaths(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->openLinks(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSource(*reinterpret_cast<QUrl*>(_v)); break;
        case 2: _t->setSearchPaths(*reinterpret_cast<QStringList*>(_v)); break;
        case 3: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setOpenLinks(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}